

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *spacePadPositive,int *ntrunc,char *fmtStart,
                 FormatArg *formatters,int *argIndex,int numFormatters)

{
  _Ios_Fmtflags _Var1;
  fmtflags fVar2;
  int iVar3;
  ios_base *piVar4;
  FormatArg *pFVar5;
  streamsize sVar6;
  bool bVar7;
  int local_50;
  int iStack_4c;
  bool intConversion;
  int precision;
  int width;
  char *c;
  int widthExtra;
  bool widthSet;
  bool precisionSet;
  int *argIndex_local;
  FormatArg *formatters_local;
  char *fmtStart_local;
  int *ntrunc_local;
  bool *spacePadPositive_local;
  ostream *out_local;
  
  _widthExtra = argIndex;
  argIndex_local = (int *)formatters;
  formatters_local = (FormatArg *)fmtStart;
  fmtStart_local = (char *)ntrunc;
  ntrunc_local = (int *)spacePadPositive;
  spacePadPositive_local = (bool *)out;
  if (*fmtStart != '%') {
    __assert_fail("0 && \"tinyformat: Not enough conversion specifiers in format string\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                  ,0x259,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  std::ios_base::width
            ((ios_base *)((long)&out->_vptr_basic_ostream + (long)out->_vptr_basic_ostream[-3]),0);
  std::ios_base::precision
            ((ios_base *)
             (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18)),6);
  std::ios::fill((char)spacePadPositive_local +
                 (char)*(undefined8 *)(*(long *)spacePadPositive_local + -0x18));
  piVar4 = (ios_base *)(spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18))
  ;
  _Var1 = std::operator|(_S_adjustfield,_S_basefield);
  _Var1 = std::operator|(_Var1,_S_floatfield);
  _Var1 = std::operator|(_Var1,_S_showbase);
  _Var1 = std::operator|(_Var1,_S_boolalpha);
  _Var1 = std::operator|(_Var1,_S_showpoint);
  _Var1 = std::operator|(_Var1,_S_showpos);
  _Var1 = std::operator|(_Var1,_S_uppercase);
  std::ios_base::unsetf(piVar4,_Var1);
  c._7_1_ = 0;
  c._6_1_ = 0;
  c._0_4_ = 0;
  _precision = formatters_local;
  do {
    _precision = (FormatArg *)((long)&_precision->m_value + 1);
    switch(*(undefined1 *)&_precision->m_value) {
    case 0x20:
      fVar2 = std::ios_base::flags
                        ((ios_base *)
                         (spacePadPositive_local +
                         *(long *)(*(long *)spacePadPositive_local + -0x18)));
      _Var1 = std::operator&(fVar2,_S_showpos);
      if (_Var1 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
        *(undefined1 *)ntrunc_local = 1;
      }
      break;
    default:
      if (('/' < *(char *)&_precision->m_value) && (*(char *)&_precision->m_value < ':')) {
        c._6_1_ = 1;
        piVar4 = (ios_base *)
                 (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18));
        iVar3 = parseIntAndAdvance((char **)&precision);
        std::ios_base::width(piVar4,(long)iVar3);
      }
      if (*(char *)&_precision->m_value == '*') {
        c._6_1_ = 1;
        if (numFormatters <= *_widthExtra) {
          __assert_fail("0 && \"tinyformat: Not enough arguments to read variable width\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                        ,0x29a,
                        "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                       );
        }
        iVar3 = *_widthExtra;
        *_widthExtra = iVar3 + 1;
        iStack_4c = FormatArg::toInt((FormatArg *)(argIndex_local + (long)iVar3 * 6));
        if (iStack_4c < 0) {
          std::ios::fill((char)spacePadPositive_local +
                         (char)*(undefined8 *)(*(long *)spacePadPositive_local + -0x18));
          std::ios_base::setf((ios_base *)
                              (spacePadPositive_local +
                              *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_left,
                              _S_adjustfield);
          iStack_4c = -iStack_4c;
        }
        std::ios_base::width
                  ((ios_base *)
                   (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18)),
                   (long)iStack_4c);
        _precision = (FormatArg *)((long)&_precision->m_value + 1);
      }
      if (*(char *)&_precision->m_value == '.') {
        pFVar5 = (FormatArg *)((long)&_precision->m_value + 1);
        local_50 = 0;
        if (*(char *)&pFVar5->m_value == '*') {
          _precision = (FormatArg *)((long)&_precision->m_value + 2);
          if (numFormatters <= *_widthExtra) {
            __assert_fail("0 && \"tinyformat: Not enough arguments to read variable precision\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                          ,0x2b0,
                          "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                         );
          }
          iVar3 = *_widthExtra;
          *_widthExtra = iVar3 + 1;
          local_50 = FormatArg::toInt((FormatArg *)(argIndex_local + (long)iVar3 * 6));
          pFVar5 = _precision;
        }
        else if ((*(char *)&pFVar5->m_value < '0') || ('9' < *(char *)&pFVar5->m_value)) {
          if (*(char *)&pFVar5->m_value == '-') {
            _precision = (FormatArg *)((long)&_precision->m_value + 2);
            parseIntAndAdvance((char **)&precision);
            pFVar5 = _precision;
          }
        }
        else {
          _precision = pFVar5;
          local_50 = parseIntAndAdvance((char **)&precision);
          pFVar5 = _precision;
        }
        _precision = pFVar5;
        std::ios_base::precision
                  ((ios_base *)
                   (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18)),
                   (long)local_50);
        c._7_1_ = 1;
      }
      while( true ) {
        bVar7 = true;
        if ((((*(char *)&_precision->m_value != 'l') &&
             (bVar7 = true, *(char *)&_precision->m_value != 'h')) &&
            (bVar7 = true, *(char *)&_precision->m_value != 'L')) &&
           ((bVar7 = true, *(char *)&_precision->m_value != 'j' &&
            (bVar7 = true, *(char *)&_precision->m_value != 'z')))) {
          bVar7 = *(char *)&_precision->m_value == 't';
        }
        if (!bVar7) break;
        _precision = (FormatArg *)((long)&_precision->m_value + 1);
      }
      bVar7 = false;
      switch(*(undefined1 *)&_precision->m_value) {
      case 0:
        __assert_fail("0 && \"tinyformat: Conversion spec incorrectly \" \"terminated by end of string\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x2fd,
                      "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                     );
      default:
        break;
      case 0x41:
      case 0x61:
        __assert_fail("0 && \"tinyformat: the %a and %A conversion specs \" \"are not supported\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x2ec,
                      "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                     );
      case 0x45:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_uppercase);
      case 0x65:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_scientific,
                            _S_floatfield);
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_dec,_S_basefield)
        ;
        break;
      case 0x46:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_uppercase);
      case 0x66:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_fixed,
                            _S_floatfield);
        break;
      case 0x47:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_uppercase);
      case 0x67:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_dec,_S_basefield)
        ;
        piVar4 = (ios_base *)
                 (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18));
        fVar2 = std::ios_base::flags
                          ((ios_base *)
                           (spacePadPositive_local +
                           *(long *)(*(long *)spacePadPositive_local + -0x18)));
        _Var1 = std::operator~(_S_floatfield);
        _Var1 = std::operator&(fVar2,_Var1);
        std::ios_base::flags(piVar4,_Var1);
        break;
      case 0x58:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_uppercase);
      case 0x70:
      case 0x78:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_hex,_S_basefield)
        ;
        bVar7 = true;
        break;
      case 99:
        break;
      case 100:
      case 0x69:
      case 0x75:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_dec,_S_basefield)
        ;
        bVar7 = true;
        break;
      case 0x6e:
        __assert_fail("0 && \"tinyformat: %n conversion spec not supported\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x2f9,
                      "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                     );
      case 0x6f:
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_oct,_S_basefield)
        ;
        bVar7 = true;
        break;
      case 0x73:
        if ((c._7_1_ & 1) != 0) {
          sVar6 = std::ios_base::precision
                            ((ios_base *)
                             (spacePadPositive_local +
                             *(long *)(*(long *)spacePadPositive_local + -0x18)));
          *(int *)fmtStart_local = (int)sVar6;
        }
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_boolalpha);
      }
      if (((bVar7) && ((c._7_1_ & 1) != 0)) && ((c._6_1_ & 1) == 0)) {
        piVar4 = (ios_base *)
                 (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18));
        sVar6 = std::ios_base::precision
                          ((ios_base *)
                           (spacePadPositive_local +
                           *(long *)(*(long *)spacePadPositive_local + -0x18)));
        std::ios_base::width(piVar4,sVar6 + (int)c);
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_internal,
                            _S_adjustfield);
        std::ios::fill((char)spacePadPositive_local +
                       (char)*(undefined8 *)(*(long *)spacePadPositive_local + -0x18));
      }
      return (char *)((long)&_precision->m_value + 1);
    case 0x23:
      piVar4 = (ios_base *)
               (spacePadPositive_local + *(long *)(*(long *)spacePadPositive_local + -0x18));
      _Var1 = std::operator|(_S_showpoint,_S_showbase);
      std::ios_base::setf(piVar4,_Var1);
      break;
    case 0x2b:
      std::ios_base::setf((ios_base *)
                          (spacePadPositive_local +
                          *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_showpos);
      *(undefined1 *)ntrunc_local = 0;
      c._0_4_ = 1;
      break;
    case 0x2d:
      std::ios::fill((char)spacePadPositive_local +
                     (char)*(undefined8 *)(*(long *)spacePadPositive_local + -0x18));
      std::ios_base::setf((ios_base *)
                          (spacePadPositive_local +
                          *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_left,_S_adjustfield
                         );
      break;
    case 0x30:
      fVar2 = std::ios_base::flags
                        ((ios_base *)
                         (spacePadPositive_local +
                         *(long *)(*(long *)spacePadPositive_local + -0x18)));
      _Var1 = std::operator&(fVar2,_S_left);
      if (_Var1 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
        std::ios::fill((char)spacePadPositive_local +
                       (char)*(undefined8 *)(*(long *)spacePadPositive_local + -0x18));
        std::ios_base::setf((ios_base *)
                            (spacePadPositive_local +
                            *(long *)(*(long *)spacePadPositive_local + -0x18)),_S_internal,
                            _S_adjustfield);
      }
    }
  } while( true );
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* formatters,
                                         int& argIndex, int numFormatters)
{
    if(*fmtStart != '%')
    {
        TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
        return fmtStart;
    }
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;
    // 1) Parse flags
    for(;; ++c)
    {
        switch(*c)
        {
            case '#':
                out.setf(std::ios::showpoint | std::ios::showbase);
                continue;
            case '0':
                // overridden by left alignment ('-' flag)
                if(!(out.flags() & std::ios::left))
                {
                    // Use internal padding so that numeric values are
                    // formatted correctly, eg -00010 rather than 000-10
                    out.fill('0');
                    out.setf(std::ios::internal, std::ios::adjustfield);
                }
                continue;
            case '-':
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                continue;
            case ' ':
                // overridden by show positive sign, '+' flag.
                if(!(out.flags() & std::ios::showpos))
                    spacePadPositive = true;
                continue;
            case '+':
                out.setf(std::ios::showpos);
                spacePadPositive = false;
                widthExtra = 1;
                continue;
            default:
                break;
        }
        break;
    }
    // 2) Parse width
    if(*c >= '0' && *c <= '9')
    {
        widthSet = true;
        out.width(parseIntAndAdvance(c));
    }
    if(*c == '*')
    {
        widthSet = true;
        int width = 0;
        if(argIndex < numFormatters)
            width = formatters[argIndex++].toInt();
        else
            TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width");
        if(width < 0)
        {
            // negative widths correspond to '-' flag set
            out.fill(' ');
            out.setf(std::ios::left, std::ios::adjustfield);
            width = -width;
        }
        out.width(width);
        ++c;
    }
    // 3) Parse precision
    if(*c == '.')
    {
        ++c;
        int precision = 0;
        if(*c == '*')
        {
            ++c;
            if(argIndex < numFormatters)
                precision = formatters[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable precision");
        }
        else
        {
            if(*c >= '0' && *c <= '9')
                precision = parseIntAndAdvance(c);
            else if(*c == '-') // negative precisions ignored, treated as zero.
                parseIntAndAdvance(++c);
        }
        out.precision(precision);
        precisionSet = true;
    }
    // 4) Ignore any C99 length modifier
    while(*c == 'l' || *c == 'h' || *c == 'L' ||
          *c == 'j' || *c == 'z' || *c == 't')
        ++c;
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch(*c)
    {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'a': case 'A':
            TINYFORMAT_ERROR("tinyformat: the %a and %A conversion specs "
                             "are not supported");
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if(precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if(intConversion && precisionSet && !widthSet)
    {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}